

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void golemeffects(monst *mon,int damtype,int dam)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  
  if (mon->data == mons + 0x106) {
    if (damtype != 6) {
      bVar4 = (damtype & 0xfffffffeU) != 2;
      iVar3 = 0;
      goto LAB_001eb884;
    }
    iVar3 = dam / 6;
  }
  else {
    if (mon->data != mons + 0x10a) {
      return;
    }
    iVar3 = 0;
    if (damtype == 6) {
      bVar4 = false;
      goto LAB_001eb884;
    }
    iVar3 = 0;
    if (damtype == 2) {
      bVar4 = true;
      iVar3 = dam;
      goto LAB_001eb884;
    }
  }
  bVar4 = true;
LAB_001eb884:
  if ((!bVar4) && ((*(uint *)&mon->field_0x60 & 0xc00) != 0x400)) {
    mon_adjust_speed(mon,-1,(obj *)0x0);
  }
  if (iVar3 != 0) {
    iVar3 = mon->mhpmax;
    if (mon->mhp < iVar3) {
      iVar1 = mon->mhp + dam;
      if (iVar3 <= iVar1) {
        iVar1 = iVar3;
      }
      mon->mhp = iVar1;
      if ((viz_array[mon->my][mon->mx] & 2U) != 0) {
        pcVar2 = Monnam(mon);
        pline("%s seems healthier.",pcVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void golemeffects(struct monst *mon, int damtype, int dam)
{
    int heal = 0, slow = 0;

    if (mon->data == &mons[PM_FLESH_GOLEM]) {
	if (damtype == AD_ELEC) heal = dam / 6;
	else if (damtype == AD_FIRE || damtype == AD_COLD) slow = 1;
    } else if (mon->data == &mons[PM_IRON_GOLEM]) {
	if (damtype == AD_ELEC) slow = 1;
	else if (damtype == AD_FIRE) heal = dam;
    } else {
	return;
    }
    if (slow) {
	if (mon->mspeed != MSLOW)
	    mon_adjust_speed(mon, -1, NULL);
    }
    if (heal) {
	if (mon->mhp < mon->mhpmax) {
	    mon->mhp += dam;
	    if (mon->mhp > mon->mhpmax) mon->mhp = mon->mhpmax;
	    if (cansee(mon->mx, mon->my))
		pline("%s seems healthier.", Monnam(mon));
	}
    }
}